

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraffic.cpp
# Opt level: O1

void XPluginReceiveMessage(XPLMPluginID inFrom,int inMsg,void *param_3)

{
  bool bIntoVR;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char who [256];
  char signature [256];
  undefined1 local_218 [256];
  char local_118;
  char cStack_117;
  char cStack_116;
  char cStack_115;
  char cStack_114;
  char cStack_113;
  char cStack_112;
  char cStack_111;
  char cStack_110;
  char cStack_10f;
  char cStack_10e;
  char cStack_10d;
  char cStack_10c;
  char cStack_10b;
  char cStack_10a;
  char cStack_109;
  char cStack_108;
  char cStack_107;
  char cStack_106;
  char cStack_105;
  char cStack_104;
  char cStack_103;
  char cStack_102;
  char cStack_101;
  char cStack_100;
  char cStack_ff;
  char cStack_fe;
  char cStack_fd;
  
  if (inMsg == 0x6f) {
    memset(local_218,0,0x100);
    local_218[0] = 0x3f;
    memset(&local_118,0,0x100);
    XPLMGetPluginInfo(inFrom,local_218,0,&local_118,0);
    auVar2[0] = -(cStack_10c == 'i');
    auVar2[1] = -(cStack_10b == 'n');
    auVar2[2] = -(cStack_10a == '.');
    auVar2[3] = -(cStack_109 == 'X');
    auVar2[4] = -(cStack_108 == 'P');
    auVar2[5] = -(cStack_107 == 'M');
    auVar2[6] = -(cStack_106 == 'P');
    auVar2[7] = -(cStack_105 == '2');
    auVar2[8] = -(cStack_104 == '.');
    auVar2[9] = -(cStack_103 == 'R');
    auVar2[10] = -(cStack_102 == 'e');
    auVar2[0xb] = -(cStack_101 == 'm');
    auVar2[0xc] = -(cStack_100 == 'o');
    auVar2[0xd] = -(cStack_ff == 't');
    auVar2[0xe] = -(cStack_fe == 'e');
    auVar2[0xf] = -(cStack_fd == '\0');
    auVar1[0] = -(local_118 == 'T');
    auVar1[1] = -(cStack_117 == 'w');
    auVar1[2] = -(cStack_116 == 'i');
    auVar1[3] = -(cStack_115 == 'n');
    auVar1[4] = -(cStack_114 == 'F');
    auVar1[5] = -(cStack_113 == 'a');
    auVar1[6] = -(cStack_112 == 'n');
    auVar1[7] = -(cStack_111 == '.');
    auVar1[8] = -(cStack_110 == 'p');
    auVar1[9] = -(cStack_10f == 'l');
    auVar1[10] = -(cStack_10e == 'u');
    auVar1[0xb] = -(cStack_10d == 'g');
    auVar1[0xc] = -(cStack_10c == 'i');
    auVar1[0xd] = -(cStack_10b == 'n');
    auVar1[0xe] = -(cStack_10a == '.');
    auVar1[0xf] = -(cStack_109 == 'X');
    auVar1 = auVar1 & auVar2;
    if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar1[0xf] >> 7) << 0xf) == 0xffff) {
      if ((int)dataRefs.iLogLevel < 2) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LiveTraffic.cpp"
               ,0x281,"XPluginReceiveMessage",logINFO,
               "XPMP2 Remote Client requested us to release TCAS / AI control, so we do.");
      }
      LTMainReleaseAIAircraft();
      MenuUpdateAllItemStatus();
    }
    else {
      if ((int)dataRefs.iLogLevel < 2) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LiveTraffic.cpp"
               ,0x285,"XPluginReceiveMessage",logINFO,
               "%s requested us to release TCAS / AI control. Switch off \'TCAS controlled\' if you want so."
               ,local_218);
      }
      CreateMsgWindow(8.0,logINFO,
                      "%s requested us to release TCAS / AI control. Switch off \'TCAS controlled\' if you want so."
                      ,local_218);
    }
  }
  else if (inFrom == 0) {
    if (inMsg == 0x6e) {
      bIntoVR = false;
    }
    else {
      if (inMsg != 0x6d) {
        return;
      }
      bIntoVR = true;
    }
    ACIWnd::MoveAllVR(bIntoVR);
    return;
  }
  return;
}

Assistant:

PLUGIN_API void XPluginReceiveMessage(XPLMPluginID inFrom, int inMsg, void * /*inParam*/)
{
    // *** Some other plugin asks for AI release,
    //     but as we are showing live planes we won't give up automatically,
    //     but we tell our user
    if (inMsg == XPLM_MSG_RELEASE_PLANES)
    {
        char who[256] = "?";
        char signature[256] = "";
        XPLMGetPluginInfo(inFrom, who, NULL, signature, NULL);
        
        // We do cease control to the XPMP2 Remote Control plugin
        // because that one will display our traffic, too:
        if (strncmp(signature, REMOTE_SIGNATURE, sizeof(signature)) == 0) {
            LOG_MSG(logINFO, INFO_REQU_AI_REMOTE);
            LTMainReleaseAIAircraft();
            MenuUpdateAllItemStatus();
        } else {
            SHOW_MSG(logINFO, INFO_REQU_AI_RELEASE, who);
        }
        return;
    }

    // Otherwise, we only process msgs from X-Plane
    if (inFrom != XPLM_PLUGIN_XPLANE)
        return;
    
#ifdef DEBUG
    // for me not having a VR rig I do some basic testing with sending XPLM_MSG_AIRPLANE_COUNT_CHANGED
    if (inMsg == XPLM_MSG_AIRPLANE_COUNT_CHANGED) {
        dataRefs.bSimVREntered = !dataRefs.bSimVREntered;
        inMsg = dataRefs.bSimVREntered ? XPLM_MSG_ENTERED_VR : XPLM_MSG_EXITING_VR;
    }
#endif
    
    switch (inMsg) {
        // *** entering VR mode ***
        case XPLM_MSG_ENTERED_VR:
            ACIWnd::MoveAllVR(true);
            break;
            
        // *** existing from VR mode ***
        case XPLM_MSG_EXITING_VR:
            ACIWnd::MoveAllVR(false);
            break;
    }
}